

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O2

void * bgetr(kmp_info_t *th,void *buf,bufsize size)

{
  void *__dest;
  size_t sVar1;
  
  __dest = bget(th,size);
  if (buf != (void *)0x0 && __dest != (void *)0x0) {
    if (*(long *)((long)buf + -0x10) == 0) {
      sVar1 = *(long *)((long)buf + -0x28) - 0x28;
    }
    else {
      sVar1 = -*(long *)((long)buf + -0x10) - 0x20;
    }
    if ((long)sVar1 < size) {
      size = sVar1;
    }
    memcpy(__dest,buf,size);
    brel(th,buf);
  }
  return __dest;
}

Assistant:

static void *bgetr(kmp_info_t *th, void *buf, bufsize size) {
  void *nbuf;
  bufsize osize; /* Old size of buffer */
  bhead_t *b;

  nbuf = bget(th, size);
  if (nbuf == NULL) { /* Acquire new buffer */
    return NULL;
  }
  if (buf == NULL) {
    return nbuf;
  }
  b = BH(((char *)buf) - sizeof(bhead_t));
  osize = -b->bb.bsize;
  if (osize == 0) {
    /*  Buffer acquired directly through acqfcn. */
    bdhead_t *bd;

    bd = BDH(((char *)buf) - sizeof(bdhead_t));
    osize = bd->tsize - (bufsize)sizeof(bdhead_t);
  } else {
    osize -= sizeof(bhead_t);
  }

  KMP_DEBUG_ASSERT(osize > 0);

  (void)KMP_MEMCPY((char *)nbuf, (char *)buf, /* Copy the data */
                   (size_t)((size < osize) ? size : osize));
  brel(th, buf);

  return nbuf;
}